

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O1

bool duckdb::MultiplyPropagateStatistics::Operation<short,duckdb::TryMultiplyOperator>
               (LogicalType *type,BaseStatistics *lstats,BaseStatistics *rstats,Value *new_min,
               Value *new_max)

{
  bool bVar1;
  short sVar2;
  short sVar3;
  long lVar4;
  BaseStatistics *pBVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  BaseStatistics *pBVar10;
  BaseStatistics *pBVar11;
  bool bVar12;
  bool bVar13;
  short lvals [2];
  short local_7c [2];
  Value *local_78;
  Value local_70;
  
  pBVar5 = lstats;
  local_78 = new_max;
  local_7c[0] = NumericStats::GetMin<short>(lstats);
  local_7c[1] = NumericStats::GetMax<short>(lstats);
  sVar2 = NumericStats::GetMin<short>(rstats);
  sVar3 = NumericStats::GetMax<short>(rstats);
  uVar9 = 0x7fff;
  pBVar11 = (BaseStatistics *)0x8000;
  bVar13 = true;
  lVar4 = 0;
  do {
    uVar8 = (int)sVar2 * (int)local_7c[lVar4];
    pBVar5 = (BaseStatistics *)((ulong)pBVar5 & 0xffffffff);
    if ((int)(short)uVar8 == uVar8) {
      pBVar5 = (BaseStatistics *)(ulong)uVar8;
    }
    pBVar10 = (BaseStatistics *)(ulong)uVar9;
    if ((short)pBVar5 < (short)uVar9) {
      pBVar10 = pBVar5;
    }
    uVar7 = (uint)pBVar5;
    if ((short)pBVar5 <= (short)pBVar11) {
      uVar7 = (uint)pBVar11;
    }
    bVar12 = (int)(short)uVar8 != uVar8;
    if (bVar12) {
      pBVar10 = (BaseStatistics *)(ulong)uVar9;
    }
    uVar9 = (uint)pBVar10;
    if (bVar12) {
      uVar7 = (uint)pBVar11;
    }
    pBVar11 = (BaseStatistics *)(ulong)uVar7;
    if (bVar12) {
      bVar12 = false;
    }
    else {
      uVar7 = (int)local_7c[lVar4] * (int)sVar3;
      uVar8 = uVar7 + 0x8000;
      bVar1 = false;
      do {
        bVar12 = bVar1;
        uVar9 = (uint)pBVar10;
        if (bVar12) break;
        if (uVar8 < 0x10000) {
          pBVar5 = (BaseStatistics *)(ulong)uVar7;
        }
        uVar6 = uVar9;
        if ((short)pBVar5 < (short)pBVar10) {
          uVar6 = (uint)pBVar5;
        }
        pBVar10 = pBVar5;
        if ((short)pBVar5 <= (short)pBVar11) {
          pBVar10 = pBVar11;
        }
        if (uVar8 >= 0x10000) {
          pBVar10 = pBVar11;
          uVar6 = uVar9;
        }
        uVar9 = uVar6;
        pBVar11 = pBVar10;
        pBVar10 = (BaseStatistics *)(ulong)uVar9;
        bVar1 = true;
      } while (uVar8 < 0x10000);
    }
    if (!bVar12) break;
    bVar13 = lVar4 == 0;
    lVar4 = lVar4 + 1;
  } while (bVar13);
  if (bVar13 == false) {
    Value::Numeric(&local_70,type,(long)(short)uVar9);
    Value::operator=(new_min,&local_70);
    Value::~Value(&local_70);
    Value::Numeric(&local_70,type,(long)(short)pBVar11);
    Value::operator=(local_78,&local_70);
    Value::~Value(&local_70);
  }
  return bVar13;
}

Assistant:

static bool Operation(const LogicalType &type, BaseStatistics &lstats, BaseStatistics &rstats, Value &new_min,
	                      Value &new_max) {
		// statistics propagation on the multiplication is slightly less straightforward because of negative numbers
		// the new min/max depend on the signs of the input types
		// if both are positive the result is [lmin * rmin][lmax * rmax]
		// if lmin/lmax are negative the result is [lmin * rmax][lmax * rmin]
		// etc
		// rather than doing all this switcheroo we just multiply all combinations of lmin/lmax with rmin/rmax
		// and check what the minimum/maximum value is
		T lvals[] {NumericStats::GetMin<T>(lstats), NumericStats::GetMax<T>(lstats)};
		T rvals[] {NumericStats::GetMin<T>(rstats), NumericStats::GetMax<T>(rstats)};
		T min = NumericLimits<T>::Maximum();
		T max = NumericLimits<T>::Minimum();
		// multiplications
		for (idx_t l = 0; l < 2; l++) {
			for (idx_t r = 0; r < 2; r++) {
				T result;
				if (!OP::Operation(lvals[l], rvals[r], result)) {
					// potential overflow
					return true;
				}
				if (result < min) {
					min = result;
				}
				if (result > max) {
					max = result;
				}
			}
		}
		new_min = Value::Numeric(type, min);
		new_max = Value::Numeric(type, max);
		return false;
	}